

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O1

size_t Curl_strlcat(char *dst,char *src,size_t siz)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  
  pcVar5 = dst;
  if (siz != 0) {
    pcVar4 = dst;
    sVar8 = siz;
    do {
      pcVar5 = pcVar4;
      if (*pcVar4 == '\0') break;
      pcVar4 = pcVar4 + 1;
      sVar8 = sVar8 - 1;
      pcVar5 = dst + siz;
    } while (sVar8 != 0);
  }
  lVar7 = (long)pcVar5 - (long)dst;
  lVar6 = siz - lVar7;
  if (lVar6 == 0) {
    sVar3 = strlen(src);
  }
  else {
    cVar2 = *src;
    pcVar4 = src;
    while (cVar2 != '\0') {
      if (lVar6 == 1) {
        lVar6 = 1;
      }
      else {
        *pcVar5 = cVar2;
        pcVar5 = pcVar5 + 1;
        lVar6 = lVar6 + -1;
      }
      pcVar1 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
      cVar2 = *pcVar1;
    }
    *pcVar5 = '\0';
    sVar3 = (long)pcVar4 - (long)src;
  }
  return sVar3 + lVar7;
}

Assistant:

size_t Curl_strlcat(char *dst, const char *src, size_t siz)
{
  char *d = dst;
  const char *s = src;
  size_t n = siz;
  union {
    ssize_t sig;
     size_t uns;
  } dlen;

  /* Find the end of dst and adjust bytes left but don't go past end */
  while(n-- != 0 && *d != '\0')
    d++;
  dlen.sig = d - dst;
  n = siz - dlen.uns;

  if(n == 0)
    return(dlen.uns + strlen(s));
  while(*s != '\0') {
    if(n != 1) {
      *d++ = *s;
      n--;
    }
    s++;
  }
  *d = '\0';

  return(dlen.uns + (s - src));     /* count does not include NUL */
}